

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * load_jpeg_image(stbi__jpeg *z,int *out_x,int *out_y,int *comp,int req_comp)

{
  uint uVar1;
  stbi_uc sVar2;
  stbi_uc sVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  long *plVar8;
  void *pvVar9;
  long lVar10;
  undefined4 uVar11;
  undefined4 *in_RCX;
  long lVar12;
  undefined4 *in_RDX;
  stbi_uc *psVar13;
  undefined4 *in_RSI;
  long *in_RDI;
  int in_R8D;
  stbi_uc *y_1;
  stbi_uc b;
  stbi_uc g;
  stbi_uc r_2;
  stbi_uc m_2;
  stbi_uc m_1;
  stbi_uc m;
  stbi_uc *y;
  int y_bot;
  stbi__resample *r_1;
  stbi_uc *out;
  stbi__resample *r;
  stbi__resample res_comp [4];
  stbi_uc *coutput [4];
  stbi_uc *output;
  uint j;
  uint i;
  int k;
  int is_rgb;
  int decode_n;
  int n;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  long local_1a0;
  stbi__jpeg *in_stack_fffffffffffffe68;
  byte local_177;
  byte local_176;
  byte local_175;
  int local_174;
  stbi_uc *local_148;
  long local_138 [3];
  uint auStack_120 [42];
  long local_78 [5];
  stbi_uc *local_50;
  uint local_44;
  uint local_40;
  int local_3c;
  uint local_38;
  int local_34;
  int local_30;
  int local_2c;
  undefined4 *local_28;
  undefined4 *local_20;
  undefined4 *local_18;
  long *local_10;
  stbi_uc *local_8;
  
  *(undefined4 *)(*in_RDI + 8) = 0;
  if ((in_R8D < 0) || (4 < in_R8D)) {
    stbi__err("Internal error");
    local_8 = (stbi_uc *)0x0;
  }
  else {
    local_2c = in_R8D;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    iVar7 = stbi__decode_jpeg_image(in_stack_fffffffffffffe68);
    if (iVar7 == 0) {
      stbi__cleanup_jpeg((stbi__jpeg *)0x1a06e8);
      local_8 = (stbi_uc *)0x0;
    }
    else {
      if (local_2c == 0) {
        local_174 = 1;
        if (2 < *(int *)(*local_10 + 8)) {
          local_174 = 3;
        }
      }
      else {
        local_174 = local_2c;
      }
      local_30 = local_174;
      local_175 = 0;
      if (*(int *)(*local_10 + 8) == 3) {
        local_176 = 1;
        if ((int)local_10[0x90a] != 3) {
          local_177 = 0;
          if (*(int *)((long)local_10 + 0x484c) == 0) {
            local_177 = (int)local_10[0x909] != 0 ^ 0xff;
          }
          local_176 = local_177;
        }
        local_175 = local_176;
      }
      local_38 = (uint)(local_175 & 1);
      if (((*(int *)(*local_10 + 8) == 3) && (local_174 < 3)) && (local_38 == 0)) {
        local_34 = 1;
      }
      else {
        local_34 = *(int *)(*local_10 + 8);
      }
      memset(local_78,0,0x20);
      for (local_3c = 0; local_3c < local_34; local_3c = local_3c + 1) {
        lVar12 = (long)local_3c;
        plVar8 = local_138 + lVar12 * 6;
        pvVar9 = stbi__malloc(0x1a0866);
        local_10[(long)local_3c * 0xc + 0x8dd] = (long)pvVar9;
        if (local_10[(long)local_3c * 0xc + 0x8dd] == 0) {
          stbi__cleanup_jpeg((stbi__jpeg *)0x1a08bb);
          stbi__err("Out of memory");
          return (stbi_uc *)0x0;
        }
        auStack_120[lVar12 * 0xc] =
             (int)local_10[0x8d1] / *(int *)((long)local_10 + (long)local_3c * 0x60 + 0x46a4);
        auStack_120[lVar12 * 0xc + 1] =
             *(int *)((long)local_10 + 0x468c) / (int)local_10[(long)local_3c * 0xc + 0x8d5];
        auStack_120[lVar12 * 0xc + 3] = (int)auStack_120[lVar12 * 0xc + 1] >> 1;
        auStack_120[lVar12 * 0xc + 2] =
             ((*(int *)*local_10 + auStack_120[lVar12 * 0xc]) - 1) / auStack_120[lVar12 * 0xc];
        auStack_120[lVar12 * 0xc + 4] = 0;
        lVar10 = local_10[(long)local_3c * 0xc + 0x8da];
        *(long *)(auStack_120 + lVar12 * 0xc + -2) = lVar10;
        local_138[lVar12 * 6 + 1] = lVar10;
        if ((auStack_120[lVar12 * 0xc] == 1) && (auStack_120[lVar12 * 0xc + 1] == 1)) {
          *plVar8 = (long)resample_row_1;
        }
        else if ((auStack_120[lVar12 * 0xc] == 1) && (auStack_120[lVar12 * 0xc + 1] == 2)) {
          *plVar8 = (long)stbi__resample_row_v_2;
        }
        else if ((auStack_120[lVar12 * 0xc] == 2) && (auStack_120[lVar12 * 0xc + 1] == 1)) {
          *plVar8 = (long)stbi__resample_row_h_2;
        }
        else if ((auStack_120[lVar12 * 0xc] == 2) && (auStack_120[lVar12 * 0xc + 1] == 2)) {
          *plVar8 = local_10[0x910];
        }
        else {
          *plVar8 = (long)stbi__resample_row_generic;
        }
      }
      local_50 = (stbi_uc *)
                 stbi__malloc_mad3(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58,0,0x1a0ad0);
      if (local_50 == (stbi_uc *)0x0) {
        stbi__cleanup_jpeg((stbi__jpeg *)0x1a0af0);
        stbi__err("Out of memory");
        local_8 = (stbi_uc *)0x0;
      }
      else {
        for (local_44 = 0; local_44 < *(uint *)(*local_10 + 4); local_44 = local_44 + 1) {
          local_148 = local_50 + local_30 * *(int *)*local_10 * local_44;
          for (local_3c = 0; local_3c < local_34; local_3c = local_3c + 1) {
            lVar12 = (long)local_3c;
            if ((int)auStack_120[lVar12 * 0xc + 3] < (int)auStack_120[lVar12 * 0xc + 1] >> 1) {
              lVar10 = local_138[lVar12 * 6 + 1];
              local_1a0 = *(long *)(auStack_120 + lVar12 * 0xc + -2);
            }
            else {
              lVar10 = *(long *)(auStack_120 + lVar12 * 0xc + -2);
              local_1a0 = local_138[lVar12 * 6 + 1];
            }
            lVar10 = (*(code *)local_138[lVar12 * 6])
                               (local_10[(long)local_3c * 0xc + 0x8dd],lVar10,local_1a0,
                                auStack_120[lVar12 * 0xc + 2],auStack_120[lVar12 * 0xc]);
            local_78[local_3c] = lVar10;
            uVar1 = auStack_120[lVar12 * 0xc + 3];
            auStack_120[lVar12 * 0xc + 3] = uVar1 + 1;
            if ((int)auStack_120[lVar12 * 0xc + 1] <= (int)(uVar1 + 1)) {
              auStack_120[lVar12 * 0xc + 3] = 0;
              local_138[lVar12 * 6 + 1] = *(long *)(auStack_120 + lVar12 * 0xc + -2);
              uVar1 = auStack_120[lVar12 * 0xc + 4];
              auStack_120[lVar12 * 0xc + 4] = uVar1 + 1;
              if ((int)(uVar1 + 1) < (int)local_10[(long)local_3c * 0xc + 0x8d8]) {
                *(long *)(auStack_120 + lVar12 * 0xc + -2) =
                     *(long *)(auStack_120 + lVar12 * 0xc + -2) +
                     (long)*(int *)((long)local_10 + (long)local_3c * 0x60 + 0x46c4);
              }
            }
          }
          if (local_30 < 3) {
            if (local_38 == 0) {
              if ((*(int *)(*local_10 + 8) == 4) && (*(int *)((long)local_10 + 0x484c) == 0)) {
                for (local_40 = 0; local_40 < *(uint *)*local_10; local_40 = local_40 + 1) {
                  sVar3 = *(stbi_uc *)(local_78[3] + (ulong)local_40);
                  bVar4 = stbi__blinn_8x8(*(stbi_uc *)(local_78[0] + (ulong)local_40),sVar3);
                  bVar5 = stbi__blinn_8x8(*(stbi_uc *)(local_78[1] + (ulong)local_40),sVar3);
                  bVar6 = stbi__blinn_8x8(*(stbi_uc *)(local_78[2] + (ulong)local_40),sVar3);
                  sVar3 = stbi__compute_y((uint)bVar4,(uint)bVar5,(uint)bVar6);
                  *local_148 = sVar3;
                  local_148[1] = 0xff;
                  local_148 = local_148 + local_30;
                }
              }
              else if ((*(int *)(*local_10 + 8) == 4) && (*(int *)((long)local_10 + 0x484c) == 2)) {
                for (local_40 = 0; local_40 < *(uint *)*local_10; local_40 = local_40 + 1) {
                  sVar3 = stbi__blinn_8x8(0xff - *(char *)(local_78[0] + (ulong)local_40),
                                          *(stbi_uc *)(local_78[3] + (ulong)local_40));
                  *local_148 = sVar3;
                  local_148[1] = 0xff;
                  local_148 = local_148 + local_30;
                }
              }
              else if (local_30 == 1) {
                for (local_40 = 0; local_40 < *(uint *)*local_10; local_40 = local_40 + 1) {
                  local_148[local_40] = *(stbi_uc *)(local_78[0] + (ulong)local_40);
                }
              }
              else {
                for (local_40 = 0; local_40 < *(uint *)*local_10; local_40 = local_40 + 1) {
                  psVar13 = local_148 + 1;
                  *local_148 = *(stbi_uc *)(local_78[0] + (ulong)local_40);
                  local_148 = local_148 + 2;
                  *psVar13 = 0xff;
                }
              }
            }
            else if (local_30 == 1) {
              for (local_40 = 0; local_40 < *(uint *)*local_10; local_40 = local_40 + 1) {
                sVar3 = stbi__compute_y((uint)*(byte *)(local_78[0] + (ulong)local_40),
                                        (uint)*(byte *)(local_78[1] + (ulong)local_40),
                                        (uint)*(byte *)(local_78[2] + (ulong)local_40));
                *local_148 = sVar3;
                local_148 = local_148 + 1;
              }
            }
            else {
              for (local_40 = 0; local_40 < *(uint *)*local_10; local_40 = local_40 + 1) {
                sVar3 = stbi__compute_y((uint)*(byte *)(local_78[0] + (ulong)local_40),
                                        (uint)*(byte *)(local_78[1] + (ulong)local_40),
                                        (uint)*(byte *)(local_78[2] + (ulong)local_40));
                *local_148 = sVar3;
                local_148[1] = 0xff;
                local_148 = local_148 + 2;
              }
            }
          }
          else if (*(int *)(*local_10 + 8) == 3) {
            if (local_38 == 0) {
              (*(code *)local_10[0x90f])
                        (local_148,local_78[0],local_78[1],local_78[2],*(undefined4 *)*local_10,
                         local_30);
            }
            else {
              for (local_40 = 0; local_40 < *(uint *)*local_10; local_40 = local_40 + 1) {
                *local_148 = *(stbi_uc *)(local_78[0] + (ulong)local_40);
                local_148[1] = *(stbi_uc *)(local_78[1] + (ulong)local_40);
                local_148[2] = *(stbi_uc *)(local_78[2] + (ulong)local_40);
                local_148[3] = 0xff;
                local_148 = local_148 + local_30;
              }
            }
          }
          else if (*(int *)(*local_10 + 8) == 4) {
            if (*(int *)((long)local_10 + 0x484c) == 0) {
              for (local_40 = 0; local_40 < *(uint *)*local_10; local_40 = local_40 + 1) {
                sVar3 = *(stbi_uc *)(local_78[3] + (ulong)local_40);
                sVar2 = stbi__blinn_8x8(*(stbi_uc *)(local_78[0] + (ulong)local_40),sVar3);
                *local_148 = sVar2;
                sVar2 = stbi__blinn_8x8(*(stbi_uc *)(local_78[1] + (ulong)local_40),sVar3);
                local_148[1] = sVar2;
                sVar3 = stbi__blinn_8x8(*(stbi_uc *)(local_78[2] + (ulong)local_40),sVar3);
                local_148[2] = sVar3;
                local_148[3] = 0xff;
                local_148 = local_148 + local_30;
              }
            }
            else if (*(int *)((long)local_10 + 0x484c) == 2) {
              (*(code *)local_10[0x90f])
                        (local_148,local_78[0],local_78[1],local_78[2],*(undefined4 *)*local_10,
                         local_30);
              for (local_40 = 0; local_40 < *(uint *)*local_10; local_40 = local_40 + 1) {
                sVar3 = *(stbi_uc *)(local_78[3] + (ulong)local_40);
                sVar2 = stbi__blinn_8x8(0xff - *local_148,sVar3);
                *local_148 = sVar2;
                sVar2 = stbi__blinn_8x8(0xff - local_148[1],sVar3);
                local_148[1] = sVar2;
                sVar3 = stbi__blinn_8x8(0xff - local_148[2],sVar3);
                local_148[2] = sVar3;
                local_148 = local_148 + local_30;
              }
            }
            else {
              (*(code *)local_10[0x90f])
                        (local_148,local_78[0],local_78[1],local_78[2],*(undefined4 *)*local_10,
                         local_30);
            }
          }
          else {
            for (local_40 = 0; local_40 < *(uint *)*local_10; local_40 = local_40 + 1) {
              sVar3 = *(stbi_uc *)(local_78[0] + (ulong)local_40);
              local_148[2] = sVar3;
              local_148[1] = sVar3;
              *local_148 = sVar3;
              local_148[3] = 0xff;
              local_148 = local_148 + local_30;
            }
          }
        }
        stbi__cleanup_jpeg((stbi__jpeg *)0x1a15ae);
        *local_18 = *(undefined4 *)*local_10;
        *local_20 = *(undefined4 *)(*local_10 + 4);
        if (local_28 != (undefined4 *)0x0) {
          uVar11 = 1;
          if (2 < *(int *)(*local_10 + 8)) {
            uVar11 = 3;
          }
          *local_28 = uVar11;
        }
        local_8 = local_50;
      }
    }
  }
  return local_8;
}

Assistant:

static stbi_uc *load_jpeg_image(stbi__jpeg *z, int *out_x, int *out_y, int *comp, int req_comp)
{
   int n, decode_n, is_rgb;
   z->s->img_n = 0; // make stbi__cleanup_jpeg safe

   // validate req_comp
   if (req_comp < 0 || req_comp > 4) return stbi__errpuc("bad req_comp", "Internal error");

   // load a jpeg image from whichever source, but leave in YCbCr format
   if (!stbi__decode_jpeg_image(z)) { stbi__cleanup_jpeg(z); return NULL; }

   // determine actual number of components to generate
   n = req_comp ? req_comp : z->s->img_n >= 3 ? 3 : 1;

   is_rgb = z->s->img_n == 3 && (z->rgb == 3 || (z->app14_color_transform == 0 && !z->jfif));

   if (z->s->img_n == 3 && n < 3 && !is_rgb)
      decode_n = 1;
   else
      decode_n = z->s->img_n;

   // resample and color-convert
   {
      int k;
      unsigned int i,j;
      stbi_uc *output;
      stbi_uc *coutput[4] = { NULL, NULL, NULL, NULL };

      stbi__resample res_comp[4];

      for (k=0; k < decode_n; ++k) {
         stbi__resample *r = &res_comp[k];

         // allocate line buffer big enough for upsampling off the edges
         // with upsample factor of 4
         z->img_comp[k].linebuf = (stbi_uc *) stbi__malloc(z->s->img_x + 3);
         if (!z->img_comp[k].linebuf) { stbi__cleanup_jpeg(z); return stbi__errpuc("outofmem", "Out of memory"); }

         r->hs      = z->img_h_max / z->img_comp[k].h;
         r->vs      = z->img_v_max / z->img_comp[k].v;
         r->ystep   = r->vs >> 1;
         r->w_lores = (z->s->img_x + r->hs-1) / r->hs;
         r->ypos    = 0;
         r->line0   = r->line1 = z->img_comp[k].data;

         if      (r->hs == 1 && r->vs == 1) r->resample = resample_row_1;
         else if (r->hs == 1 && r->vs == 2) r->resample = stbi__resample_row_v_2;
         else if (r->hs == 2 && r->vs == 1) r->resample = stbi__resample_row_h_2;
         else if (r->hs == 2 && r->vs == 2) r->resample = z->resample_row_hv_2_kernel;
         else                               r->resample = stbi__resample_row_generic;
      }

      // can't error after this so, this is safe
      output = (stbi_uc *) stbi__malloc_mad3(n, z->s->img_x, z->s->img_y, 1);
      if (!output) { stbi__cleanup_jpeg(z); return stbi__errpuc("outofmem", "Out of memory"); }

      // now go ahead and resample
      for (j=0; j < z->s->img_y; ++j) {
         stbi_uc *out = output + n * z->s->img_x * j;
         for (k=0; k < decode_n; ++k) {
            stbi__resample *r = &res_comp[k];
            int y_bot = r->ystep >= (r->vs >> 1);
            coutput[k] = r->resample(z->img_comp[k].linebuf,
                                     y_bot ? r->line1 : r->line0,
                                     y_bot ? r->line0 : r->line1,
                                     r->w_lores, r->hs);
            if (++r->ystep >= r->vs) {
               r->ystep = 0;
               r->line0 = r->line1;
               if (++r->ypos < z->img_comp[k].y)
                  r->line1 += z->img_comp[k].w2;
            }
         }
         if (n >= 3) {
            stbi_uc *y = coutput[0];
            if (z->s->img_n == 3) {
               if (is_rgb) {
                  for (i=0; i < z->s->img_x; ++i) {
                     out[0] = y[i];
                     out[1] = coutput[1][i];
                     out[2] = coutput[2][i];
                     out[3] = 255;
                     out += n;
                  }
               } else {
                  z->YCbCr_to_RGB_kernel(out, y, coutput[1], coutput[2], z->s->img_x, n);
               }
            } else if (z->s->img_n == 4) {
               if (z->app14_color_transform == 0) { // CMYK
                  for (i=0; i < z->s->img_x; ++i) {
                     stbi_uc m = coutput[3][i];
                     out[0] = stbi__blinn_8x8(coutput[0][i], m);
                     out[1] = stbi__blinn_8x8(coutput[1][i], m);
                     out[2] = stbi__blinn_8x8(coutput[2][i], m);
                     out[3] = 255;
                     out += n;
                  }
               } else if (z->app14_color_transform == 2) { // YCCK
                  z->YCbCr_to_RGB_kernel(out, y, coutput[1], coutput[2], z->s->img_x, n);
                  for (i=0; i < z->s->img_x; ++i) {
                     stbi_uc m = coutput[3][i];
                     out[0] = stbi__blinn_8x8(255 - out[0], m);
                     out[1] = stbi__blinn_8x8(255 - out[1], m);
                     out[2] = stbi__blinn_8x8(255 - out[2], m);
                     out += n;
                  }
               } else { // YCbCr + alpha?  Ignore the fourth channel for now
                  z->YCbCr_to_RGB_kernel(out, y, coutput[1], coutput[2], z->s->img_x, n);
               }
            } else
               for (i=0; i < z->s->img_x; ++i) {
                  out[0] = out[1] = out[2] = y[i];
                  out[3] = 255; // not used if n==3
                  out += n;
               }
         } else {
            if (is_rgb) {
               if (n == 1)
                  for (i=0; i < z->s->img_x; ++i)
                     *out++ = stbi__compute_y(coutput[0][i], coutput[1][i], coutput[2][i]);
               else {
                  for (i=0; i < z->s->img_x; ++i, out += 2) {
                     out[0] = stbi__compute_y(coutput[0][i], coutput[1][i], coutput[2][i]);
                     out[1] = 255;
                  }
               }
            } else if (z->s->img_n == 4 && z->app14_color_transform == 0) {
               for (i=0; i < z->s->img_x; ++i) {
                  stbi_uc m = coutput[3][i];
                  stbi_uc r = stbi__blinn_8x8(coutput[0][i], m);
                  stbi_uc g = stbi__blinn_8x8(coutput[1][i], m);
                  stbi_uc b = stbi__blinn_8x8(coutput[2][i], m);
                  out[0] = stbi__compute_y(r, g, b);
                  out[1] = 255;
                  out += n;
               }
            } else if (z->s->img_n == 4 && z->app14_color_transform == 2) {
               for (i=0; i < z->s->img_x; ++i) {
                  out[0] = stbi__blinn_8x8(255 - coutput[0][i], coutput[3][i]);
                  out[1] = 255;
                  out += n;
               }
            } else {
               stbi_uc *y = coutput[0];
               if (n == 1)
                  for (i=0; i < z->s->img_x; ++i) out[i] = y[i];
               else
                  for (i=0; i < z->s->img_x; ++i) { *out++ = y[i]; *out++ = 255; }
            }
         }
      }
      stbi__cleanup_jpeg(z);
      *out_x = z->s->img_x;
      *out_y = z->s->img_y;
      if (comp) *comp = z->s->img_n >= 3 ? 3 : 1; // report original components, not output
      return output;
   }
}